

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O3

NodeRecord * __thiscall
embree::sse2::CreateMortonLeaf<4,_embree::InstanceArrayPrimitive>::operator()
          (NodeRecord *__return_storage_ptr__,
          CreateMortonLeaf<4,_embree::InstanceArrayPrimitive> *this,range<unsigned_int> *current,
          CachedAllocator *alloc)

{
  atomic<unsigned_long> *paVar1;
  float *pfVar2;
  pointer *pppTVar3;
  uint uVar4;
  uint uVar5;
  RTCFormat RVar6;
  uint uVar7;
  FastAllocator *this_00;
  ThreadLocal *pTVar8;
  ThreadLocal2 *this_01;
  iterator __position;
  InstanceArray *pIVar9;
  RawBufferView *pRVar10;
  char *pcVar11;
  undefined8 *puVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined8 *puVar20;
  ulong uVar21;
  ulong uVar22;
  char *pcVar23;
  size_t sVar24;
  ulong uVar25;
  long lVar26;
  Accel *pAVar27;
  long lVar28;
  undefined1 auVar29 [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar30;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar32;
  float fVar33;
  float fVar34;
  float fVar36;
  float fVar37;
  float fVar38;
  undefined1 auVar35 [16];
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float in_XMM4_Da;
  float in_XMM4_Db;
  float in_XMM4_Dc;
  float in_XMM4_Dd;
  undefined1 in_XMM6 [16];
  float fVar47;
  float fVar48;
  undefined1 in_XMM7 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar58;
  float fVar60;
  undefined1 auVar56 [16];
  float fVar59;
  float fVar61;
  undefined1 auVar57 [16];
  float fVar62;
  float fVar65;
  float fVar67;
  undefined1 auVar63 [16];
  float fVar66;
  float fVar68;
  undefined1 auVar64 [16];
  float fVar69;
  float in_XMM12_Da;
  float in_XMM12_Db;
  float in_XMM12_Dc;
  float in_XMM12_Dd;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float in_XMM14_Da;
  float in_XMM14_Db;
  float in_XMM14_Dc;
  float in_XMM14_Dd;
  float in_XMM15_Da;
  float in_XMM15_Db;
  float in_XMM15_Dc;
  float in_XMM15_Dd;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined8 *local_c8;
  undefined8 *local_c0;
  undefined1 local_b8;
  ThreadLocal2 *local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  ThreadLocal2 *local_88;
  char local_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 auVar31 [16];
  
  uVar4 = current->_begin;
  uVar5 = current->_end;
  uVar21 = (ulong)(uVar5 - uVar4);
  local_c8 = (undefined8 *)(uVar21 * 8);
  this_00 = alloc->alloc;
  pTVar8 = alloc->talloc1;
  this_01 = pTVar8->parent;
  if (this_00 != (this_01->alloc)._M_b._M_p) {
    local_80 = '\x01';
    local_88 = this_01;
    MutexSys::lock(&this_01->mutex);
    if ((this_01->alloc)._M_b._M_p != (__pointer_type)0x0) {
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesUsed;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesUsed + (this_01->alloc0).bytesUsed;
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesFree;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (((this_01->alloc0).end + (this_01->alloc1).end) -
           ((this_01->alloc0).cur + (this_01->alloc1).cur));
      UNLOCK();
      LOCK();
      paVar1 = &((this_01->alloc)._M_b._M_p)->bytesWasted;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i +
           (this_01->alloc1).bytesWasted + (this_01->alloc0).bytesWasted;
      UNLOCK();
    }
    (this_01->alloc0).bytesUsed = 0;
    (this_01->alloc0).bytesWasted = 0;
    (this_01->alloc0).end = 0;
    (this_01->alloc0).allocBlockSize = 0;
    (this_01->alloc0).ptr = (char *)0x0;
    (this_01->alloc0).cur = 0;
    if (this_00 == (FastAllocator *)0x0) {
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
    }
    else {
      (this_01->alloc0).allocBlockSize = this_00->defaultBlockSize;
      (this_01->alloc1).ptr = (char *)0x0;
      (this_01->alloc1).cur = 0;
      (this_01->alloc1).end = 0;
      (this_01->alloc1).allocBlockSize = 0;
      (this_01->alloc1).bytesUsed = 0;
      (this_01->alloc1).bytesWasted = 0;
      (this_01->alloc1).allocBlockSize = this_00->defaultBlockSize;
    }
    LOCK();
    (this_01->alloc)._M_b._M_p = this_00;
    UNLOCK();
    local_c0 = &FastAllocator::s_thread_local_allocators_lock;
    local_b8 = 1;
    local_b0 = this_01;
    MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    __position._M_current =
         (this_00->thread_local_allocators).
         super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->thread_local_allocators).
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
      ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                  *)&this_00->thread_local_allocators,__position,&local_b0);
    }
    else {
      *__position._M_current = local_b0;
      pppTVar3 = &(this_00->thread_local_allocators).
                  super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar3 = *pppTVar3 + 1;
    }
    MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
    if (local_80 == '\x01') {
      MutexSys::unlock(&local_88->mutex);
    }
  }
  puVar20 = local_c8;
  pTVar8->bytesUsed = pTVar8->bytesUsed + (long)local_c8;
  sVar24 = pTVar8->cur;
  uVar25 = (ulong)(-(int)sVar24 & 0xf);
  uVar22 = (long)local_c8 + uVar25 + sVar24;
  pTVar8->cur = uVar22;
  if (pTVar8->end < uVar22) {
    pTVar8->cur = sVar24;
    puVar12 = (undefined8 *)pTVar8->allocBlockSize;
    if ((undefined8 *)((long)local_c8 * 4) < puVar12 || (long)local_c8 * 4 - (long)puVar12 == 0) {
      local_c0 = puVar12;
      pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c0);
      pTVar8->ptr = pcVar23;
      sVar24 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
      pTVar8->bytesWasted = sVar24;
      pTVar8->end = (size_t)local_c0;
      pTVar8->cur = (size_t)puVar20;
      if (local_c0 < puVar20) {
        pTVar8->cur = 0;
        local_c0 = (undefined8 *)pTVar8->allocBlockSize;
        pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c0);
        pTVar8->ptr = pcVar23;
        sVar24 = (pTVar8->end - pTVar8->cur) + pTVar8->bytesWasted;
        pTVar8->bytesWasted = sVar24;
        pTVar8->end = (size_t)local_c0;
        pTVar8->cur = (size_t)puVar20;
        if (local_c0 < puVar20) {
          pTVar8->cur = 0;
          pcVar23 = (char *)0x0;
          local_e8 = in_XMM12_Da;
          fStack_e4 = in_XMM12_Db;
          fStack_e0 = in_XMM12_Dc;
          fStack_dc = in_XMM12_Dd;
          local_f8 = in_XMM14_Da;
          fStack_f4 = in_XMM14_Db;
          fStack_f0 = in_XMM14_Dc;
          fStack_ec = in_XMM14_Dd;
          goto LAB_00bf3a88;
        }
      }
      pTVar8->bytesWasted = sVar24;
      local_e8 = in_XMM12_Da;
      fStack_e4 = in_XMM12_Db;
      fStack_e0 = in_XMM12_Dc;
      fStack_dc = in_XMM12_Dd;
      local_f8 = in_XMM14_Da;
      fStack_f4 = in_XMM14_Db;
      fStack_f0 = in_XMM14_Dc;
      fStack_ec = in_XMM14_Dd;
    }
    else {
      pcVar23 = (char *)FastAllocator::malloc(this_00,(size_t)&local_c8);
      local_e8 = in_XMM12_Da;
      fStack_e4 = in_XMM12_Db;
      fStack_e0 = in_XMM12_Dc;
      fStack_dc = in_XMM12_Dd;
      local_f8 = in_XMM14_Da;
      fStack_f4 = in_XMM14_Db;
      fStack_f0 = in_XMM14_Dc;
      fStack_ec = in_XMM14_Dd;
    }
  }
  else {
    pTVar8->bytesWasted = pTVar8->bytesWasted + uVar25;
    pcVar23 = pTVar8->ptr + (uVar22 - (long)local_c8);
    local_e8 = in_XMM12_Da;
    fStack_e4 = in_XMM12_Db;
    fStack_e0 = in_XMM12_Dc;
    fStack_dc = in_XMM12_Dd;
    local_f8 = in_XMM14_Da;
    fStack_f4 = in_XMM14_Db;
    fStack_f0 = in_XMM14_Dc;
    fStack_ec = in_XMM14_Dd;
  }
LAB_00bf3a88:
  aVar32 = _DAT_01f7aa00;
  if (uVar5 == uVar4) {
    auVar29 = DAT_01f7a9f0._0_12_;
  }
  else {
    pIVar9 = this->mesh;
    lVar26 = 0;
    auVar31 = _DAT_01f7a9f0;
    do {
      uVar5 = this->morton[(ulong)uVar4 + lVar26].field_0.field_0.index;
      uVar22 = (ulong)uVar5;
      pAVar27 = *(Accel **)&(pIVar9->super_Geometry).field_0x58;
      if ((pAVar27 != (Accel *)0x0) ||
         (*(int *)((pIVar9->object_ids).super_RawBufferView.ptr_ofs +
                  (pIVar9->object_ids).super_RawBufferView.stride * uVar22) != -1)) {
        pRVar10 = (pIVar9->l2w_buf).items;
        RVar6 = pRVar10->format;
        if ((pIVar9->super_Geometry).field_8.field_0x1 == '\x01') {
          fVar55 = fStack_a4;
          if ((int)RVar6 < 0x9244) {
            if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar11 = pRVar10->ptr_ofs;
              lVar28 = pRVar10->stride * uVar22;
              fStack_94 = *(float *)(pcVar11 + lVar28 + 0x10);
              local_98 = *(float *)(pcVar11 + lVar28);
              local_68 = *(float *)(pcVar11 + lVar28 + 4);
              local_a8 = *(float *)(pcVar11 + lVar28 + 8);
              local_78 = *(float *)(pcVar11 + lVar28 + 0xc);
              fStack_90 = *(float *)(pcVar11 + lVar28 + 0x20);
              fStack_8c = 0.0;
              fStack_64 = *(float *)(pcVar11 + lVar28 + 0x14);
              fStack_60 = *(float *)(pcVar11 + lVar28 + 0x24);
              fStack_5c = 0.0;
              fStack_a0 = *(float *)(pcVar11 + lVar28 + 0x28);
              fStack_9c = 0.0;
              fStack_74 = *(float *)(pcVar11 + lVar28 + 0x1c);
              fStack_70 = *(float *)(pcVar11 + lVar28 + 0x2c);
              fStack_6c = 0.0;
              fVar55 = *(float *)(pcVar11 + lVar28 + 0x18);
            }
            else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar11 = pRVar10->ptr_ofs;
              lVar28 = pRVar10->stride * uVar22;
              local_98 = *(float *)(pcVar11 + lVar28);
              fStack_94 = (float)*(undefined8 *)(pcVar11 + lVar28 + 4);
              fStack_90 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 4) >> 0x20);
              fStack_8c = 0.0;
              local_68 = *(float *)(pcVar11 + lVar28 + 0xc);
              fStack_64 = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x10);
              fStack_60 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x10) >> 0x20);
              fStack_5c = 0.0;
              local_a8 = *(float *)(pcVar11 + lVar28 + 0x18);
              fStack_a0 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x1c) >> 0x20);
              fStack_9c = 0.0;
              local_78 = *(float *)(pcVar11 + lVar28 + 0x24);
              fStack_74 = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x28);
              fStack_70 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x28) >> 0x20);
              fStack_6c = 0.0;
              fVar55 = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x1c);
            }
          }
          else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar11 = pRVar10->ptr_ofs;
            lVar28 = pRVar10->stride * uVar22;
            local_a8 = *(float *)(pcVar11 + lVar28 + 0x10);
            fVar55 = *(float *)((long)(pcVar11 + lVar28 + 0x10) + 4);
            local_98 = *(float *)(pcVar11 + lVar28);
            fStack_64 = *(float *)(pcVar11 + lVar28 + 4);
            fStack_a0 = *(float *)(pcVar11 + lVar28 + 8);
            local_68 = *(float *)(pcVar11 + lVar28 + 0xc);
            fStack_94 = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x34);
            local_78 = *(float *)(pcVar11 + lVar28 + 0x18);
            fStack_74 = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x1c);
            fStack_70 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x1c) >> 0x20);
            fVar34 = *(float *)(pcVar11 + lVar28 + 0x24);
            fStack_8c = *(float *)(pcVar11 + lVar28 + 0x28);
            fVar33 = *(float *)(pcVar11 + lVar28 + 0x2c);
            fVar48 = *(float *)(pcVar11 + lVar28 + 0x30);
            fVar50 = fVar48 * fVar48 + fVar33 * fVar33 + fVar34 * fVar34 + fStack_8c * fStack_8c;
            auVar63 = rsqrtss(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50));
            fVar46 = auVar63._0_4_;
            fStack_9c = fVar46 * fVar46 * fVar50 * -0.5 * fVar46 + fVar46 * 1.5;
            fStack_6c = fVar34 * fStack_9c;
            fStack_8c = fStack_8c * fStack_9c;
            fStack_5c = fVar33 * fStack_9c;
            fStack_9c = fStack_9c * fVar48;
            fStack_a4 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x34) >> 0x20);
            fStack_60 = *(float *)(pcVar11 + lVar28 + 0x3c);
            fStack_90 = fStack_a4;
          }
          else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar11 = pRVar10->ptr_ofs;
            lVar28 = pRVar10->stride * uVar22;
            pfVar2 = (float *)(pcVar11 + lVar28);
            local_98 = *pfVar2;
            fStack_94 = pfVar2[1];
            fStack_90 = pfVar2[2];
            fStack_8c = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar28 + 0x10);
            local_68 = *pfVar2;
            fStack_64 = pfVar2[1];
            fStack_60 = pfVar2[2];
            fStack_5c = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar28 + 0x20);
            local_a8 = *pfVar2;
            fVar55 = pfVar2[1];
            fStack_a0 = pfVar2[2];
            fStack_9c = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar28 + 0x30);
            local_78 = *pfVar2;
            fStack_74 = pfVar2[1];
            fStack_70 = pfVar2[2];
            fStack_6c = pfVar2[3];
          }
          _local_a8 = CONCAT44(fVar55,local_a8);
          fVar50 = fStack_8c * fStack_5c + fStack_9c * fStack_6c;
          fVar36 = fStack_8c * fStack_5c - fStack_9c * fStack_6c;
          fVar48 = fStack_6c * fStack_6c + fStack_8c * fStack_8c + -fStack_5c * fStack_5c +
                   -fStack_9c * fStack_9c;
          fVar46 = fStack_6c * fStack_6c - fStack_8c * fStack_8c;
          fVar34 = fStack_5c * fStack_5c + fVar46 + -fStack_9c * fStack_9c;
          fVar47 = fStack_8c * fStack_9c - fStack_5c * fStack_6c;
          fVar60 = fStack_5c * fStack_6c + fStack_8c * fStack_9c;
          fVar33 = fStack_5c * fStack_9c + fStack_8c * fStack_6c;
          fVar59 = fStack_5c * fStack_9c - fStack_8c * fStack_6c;
          fVar69 = fStack_9c * fStack_9c + fVar46 + -fStack_5c * fStack_5c;
          fVar50 = fVar50 + fVar50;
          fVar47 = fVar47 + fVar47;
          fVar36 = fVar36 + fVar36;
          fVar33 = fVar33 + fVar33;
          fVar60 = fVar60 + fVar60;
          fVar59 = fVar59 + fVar59;
          fVar46 = fVar48 * 1.0 + fVar50 * 0.0 + fVar47 * 0.0;
          fVar44 = fVar48 * 0.0 + fVar50 * 1.0 + fVar47 * 0.0;
          fVar39 = fVar48 * 0.0 + fVar50 * 0.0 + fVar47 * 1.0;
          fVar41 = fVar48 * 0.0 + fVar50 * 0.0 + fVar47 * 0.0;
          fVar51 = fVar36 * 1.0 + fVar34 * 0.0 + fVar33 * 0.0;
          fVar52 = fVar36 * 0.0 + fVar34 * 1.0 + fVar33 * 0.0;
          fVar53 = fVar36 * 0.0 + fVar34 * 0.0 + fVar33 * 1.0;
          fVar54 = fVar36 * 0.0 + fVar34 * 0.0 + fVar33 * 0.0;
          fVar40 = fVar60 * 1.0 + fVar59 * 0.0 + fVar69 * 0.0;
          fVar42 = fVar60 * 0.0 + fVar59 * 1.0 + fVar69 * 0.0;
          fVar43 = fVar60 * 0.0 + fVar59 * 0.0 + fVar69 * 1.0;
          fVar45 = fVar60 * 0.0 + fVar59 * 0.0 + fVar69 * 0.0;
          fVar48 = local_68 * fVar46 + fStack_64 * fVar51 + fVar40 * 0.0;
          fVar34 = local_68 * fVar44 + fStack_64 * fVar52 + fVar42 * 0.0;
          fVar69 = local_68 * fVar39 + fStack_64 * fVar53 + fVar43 * 0.0;
          fVar47 = local_68 * fVar41 + fStack_64 * fVar54 + fVar45 * 0.0;
          fVar36 = local_a8 * fVar46 + fVar55 * fVar51 + fStack_a0 * fVar40;
          fVar37 = local_a8 * fVar44 + fVar55 * fVar52 + fStack_a0 * fVar42;
          fVar33 = local_a8 * fVar39 + fVar55 * fVar53 + fStack_a0 * fVar43;
          fVar38 = local_a8 * fVar41 + fVar55 * fVar54 + fStack_a0 * fVar45;
          fVar55 = local_98 * fVar46 + fVar51 * 0.0 + fVar40 * 0.0;
          fVar59 = local_98 * fVar44 + fVar52 * 0.0 + fVar42 * 0.0;
          fVar60 = local_98 * fVar39 + fVar53 * 0.0 + fVar43 * 0.0;
          fVar50 = local_98 * fVar41 + fVar54 * 0.0 + fVar45 * 0.0;
          fVar40 = local_78 * fVar46 + fStack_74 * fVar51 + fStack_70 * fVar40 + fStack_94 + 0.0;
          fVar42 = local_78 * fVar44 + fStack_74 * fVar52 + fStack_70 * fVar42 + fStack_90 + 0.0;
          fVar44 = local_78 * fVar39 + fStack_74 * fVar53 + fStack_70 * fVar43 + fStack_60 + 0.0;
          fVar46 = local_78 * fVar41 + fStack_74 * fVar54 + fStack_70 * fVar45 + 0.0;
        }
        else {
          fVar48 = in_XMM15_Da;
          fVar34 = in_XMM15_Db;
          fVar69 = in_XMM15_Dc;
          fVar47 = in_XMM15_Dd;
          fVar36 = local_f8;
          fVar37 = fStack_f4;
          fVar33 = fStack_f0;
          fVar38 = fStack_ec;
          fVar55 = local_e8;
          fVar59 = fStack_e4;
          fVar60 = fStack_e0;
          fVar50 = fStack_dc;
          fVar40 = in_XMM4_Da;
          fVar42 = in_XMM4_Db;
          fVar44 = in_XMM4_Dc;
          fVar46 = in_XMM4_Dd;
          if ((int)RVar6 < 0x9244) {
            if (RVar6 == RTC_FORMAT_FLOAT3X4_ROW_MAJOR) {
              pcVar11 = pRVar10->ptr_ofs;
              lVar28 = pRVar10->stride * uVar22;
              in_XMM4_Da = *(float *)(pcVar11 + lVar28 + 0xc);
              in_XMM4_Db = *(float *)(pcVar11 + lVar28 + 0x1c);
              fVar48 = *(float *)(pcVar11 + lVar28 + 4);
              fVar34 = *(float *)(pcVar11 + lVar28 + 0x14);
              fVar69 = *(float *)(pcVar11 + lVar28 + 0x24);
              fVar47 = 0.0;
              fVar36 = *(float *)(pcVar11 + lVar28 + 8);
              fVar37 = *(float *)(pcVar11 + lVar28 + 0x18);
              fVar33 = *(float *)(pcVar11 + lVar28 + 0x28);
              fVar38 = 0.0;
              fVar55 = *(float *)(pcVar11 + lVar28);
              fVar59 = *(float *)(pcVar11 + lVar28 + 0x10);
              fVar60 = *(float *)(pcVar11 + lVar28 + 0x20);
              fVar50 = 0.0;
              fVar40 = in_XMM4_Da;
              fVar42 = in_XMM4_Db;
              fVar44 = *(float *)(pcVar11 + lVar28 + 0x2c);
              fVar46 = 0.0;
              in_XMM15_Da = *(float *)(pcVar11 + lVar28 + 4);
              in_XMM15_Db = *(float *)(pcVar11 + lVar28 + 0x14);
              in_XMM15_Dc = *(float *)(pcVar11 + lVar28 + 0x24);
              in_XMM15_Dd = 0.0;
              in_XMM4_Dc = *(float *)(pcVar11 + lVar28 + 0x2c);
              in_XMM4_Dd = 0.0;
              fStack_f0 = *(float *)(pcVar11 + lVar28 + 0x28);
              fStack_ec = 0.0;
              fStack_e0 = *(float *)(pcVar11 + lVar28 + 0x20);
              fStack_dc = 0.0;
              local_e8 = *(float *)(pcVar11 + lVar28);
              fStack_e4 = *(float *)(pcVar11 + lVar28 + 0x10);
              local_f8 = *(float *)(pcVar11 + lVar28 + 8);
              fStack_f4 = *(float *)(pcVar11 + lVar28 + 0x18);
            }
            else if (RVar6 == RTC_FORMAT_FLOAT3X4_COLUMN_MAJOR) {
              pcVar11 = pRVar10->ptr_ofs;
              lVar28 = pRVar10->stride * uVar22;
              fVar59 = (float)*(undefined8 *)(pcVar11 + lVar28 + 4);
              fVar60 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 4) >> 0x20);
              fVar37 = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x1c);
              fVar33 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x1c) >> 0x20);
              in_XMM4_Db = *(float *)(pcVar11 + lVar28 + 0x30);
              in_XMM4_Da = *(float *)(pcVar11 + lVar28 + 0x24);
              fVar48 = *(float *)(pcVar11 + lVar28 + 0xc);
              fVar34 = *(float *)(pcVar11 + lVar28 + 0x18);
              fVar69 = *(float *)(pcVar11 + lVar28 + 0x1c);
              fVar47 = 0.0;
              fVar36 = *(float *)(pcVar11 + lVar28 + 0x18);
              fVar38 = 0.0;
              fVar55 = *(float *)(pcVar11 + lVar28);
              fVar50 = 0.0;
              fVar40 = in_XMM4_Da;
              fVar42 = in_XMM4_Db;
              fVar44 = *(float *)(pcVar11 + lVar28 + 0x34);
              fVar46 = 0.0;
              in_XMM15_Da = *(float *)(pcVar11 + lVar28 + 0xc);
              in_XMM15_Db = *(float *)(pcVar11 + lVar28 + 0x18);
              in_XMM15_Dc = *(float *)(pcVar11 + lVar28 + 0x1c);
              in_XMM15_Dd = 0.0;
              in_XMM4_Dc = *(float *)(pcVar11 + lVar28 + 0x34);
              in_XMM4_Dd = 0.0;
              fStack_f0 = fVar33;
              fStack_ec = 0.0;
              fStack_e0 = fVar60;
              fStack_dc = 0.0;
              local_e8 = *(float *)(pcVar11 + lVar28);
              fStack_e4 = fVar59;
              local_f8 = *(float *)(pcVar11 + lVar28 + 0x18);
              fStack_f4 = fVar37;
            }
          }
          else if (RVar6 == RTC_FORMAT_QUATERNION_DECOMPOSITION) {
            pcVar11 = pRVar10->ptr_ofs;
            lVar28 = pRVar10->stride * uVar22;
            fVar36 = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x10);
            fVar37 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x10) >> 0x20);
            fVar55 = *(float *)(pcVar11 + lVar28);
            fVar34 = *(float *)(pcVar11 + lVar28 + 4);
            fVar33 = *(float *)(pcVar11 + lVar28 + 8);
            fVar48 = *(float *)(pcVar11 + lVar28 + 0xc);
            fVar59 = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x34);
            fVar60 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x34) >> 0x20);
            in_XMM4_Da = *(float *)(pcVar11 + lVar28 + 0x18);
            in_XMM4_Db = (float)*(undefined8 *)(pcVar11 + lVar28 + 0x1c);
            fVar44 = (float)((ulong)*(undefined8 *)(pcVar11 + lVar28 + 0x1c) >> 0x20);
            fVar46 = *(float *)(pcVar11 + lVar28 + 0x24);
            fVar50 = *(float *)(pcVar11 + lVar28 + 0x28);
            fVar47 = *(float *)(pcVar11 + lVar28 + 0x2c);
            fVar69 = *(float *)(pcVar11 + lVar28 + 0x30);
            fVar40 = fVar69 * fVar69 + fVar47 * fVar47 + fVar46 * fVar46 + fVar50 * fVar50;
            auVar63 = rsqrtss(ZEXT416((uint)fVar40),ZEXT416((uint)fVar40));
            fVar38 = auVar63._0_4_;
            fVar38 = fVar38 * fVar38 * fVar40 * -0.5 * fVar38 + fVar38 * 1.5;
            fVar46 = fVar46 * fVar38;
            fVar50 = fVar50 * fVar38;
            fVar47 = fVar47 * fVar38;
            fVar38 = fVar38 * fVar69;
            fVar69 = *(float *)(pcVar11 + lVar28 + 0x3c);
            fVar40 = in_XMM4_Da;
            fVar42 = in_XMM4_Db;
            in_XMM15_Da = fVar48;
            in_XMM15_Db = fVar34;
            in_XMM15_Dc = fVar69;
            in_XMM15_Dd = fVar47;
            in_XMM4_Dc = fVar44;
            in_XMM4_Dd = fVar46;
            fStack_f0 = fVar33;
            fStack_ec = fVar38;
            fStack_e0 = fVar60;
            fStack_dc = fVar50;
            local_e8 = fVar55;
            fStack_e4 = fVar59;
            local_f8 = fVar36;
            fStack_f4 = fVar37;
          }
          else if (RVar6 == RTC_FORMAT_FLOAT4X4_COLUMN_MAJOR) {
            pcVar11 = pRVar10->ptr_ofs;
            lVar28 = pRVar10->stride * uVar22;
            pfVar2 = (float *)(pcVar11 + lVar28);
            fVar55 = *pfVar2;
            fVar59 = pfVar2[1];
            fVar60 = pfVar2[2];
            fVar50 = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar28 + 0x10);
            fVar48 = *pfVar2;
            fVar34 = pfVar2[1];
            fVar69 = pfVar2[2];
            fVar47 = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar28 + 0x20);
            fVar36 = *pfVar2;
            fVar37 = pfVar2[1];
            fVar33 = pfVar2[2];
            fVar38 = pfVar2[3];
            pfVar2 = (float *)(pcVar11 + lVar28 + 0x30);
            in_XMM4_Da = *pfVar2;
            in_XMM4_Db = pfVar2[1];
            fVar44 = pfVar2[2];
            fVar46 = pfVar2[3];
            fVar40 = in_XMM4_Da;
            fVar42 = in_XMM4_Db;
            in_XMM15_Da = fVar48;
            in_XMM15_Db = fVar34;
            in_XMM15_Dc = fVar69;
            in_XMM15_Dd = fVar47;
            in_XMM4_Dc = fVar44;
            in_XMM4_Dd = fVar46;
            fStack_f0 = fVar33;
            fStack_ec = fVar38;
            fStack_e0 = fVar60;
            fStack_dc = fVar50;
            local_e8 = fVar55;
            fStack_e4 = fVar59;
            local_f8 = fVar36;
            fStack_f4 = fVar37;
          }
        }
        if (pAVar27 == (Accel *)0x0) {
          pAVar27 = pIVar9->objects
                    [*(uint *)((pIVar9->object_ids).super_RawBufferView.ptr_ofs +
                              (pIVar9->object_ids).super_RawBufferView.stride * uVar22)];
        }
        auVar63 = minps((undefined1  [16])(pAVar27->super_AccelData).bounds.bounds0.lower.field_0,
                        (undefined1  [16])(pAVar27->super_AccelData).bounds.bounds1.lower.field_0);
        auVar56 = maxps((undefined1  [16])(pAVar27->super_AccelData).bounds.bounds0.upper.field_0,
                        (undefined1  [16])(pAVar27->super_AccelData).bounds.bounds1.upper.field_0);
        fVar73 = auVar63._0_4_;
        fVar65 = auVar63._4_4_;
        fVar39 = auVar63._8_4_;
        fVar62 = fVar39 * fVar36 + fVar40;
        fVar66 = fVar39 * fVar37 + fVar42;
        fVar67 = fVar39 * fVar33 + fVar44;
        fVar68 = fVar39 * fVar38 + fVar46;
        fVar51 = fVar65 * fVar48 + fVar62;
        fVar52 = fVar65 * fVar34 + fVar66;
        fVar53 = fVar65 * fVar69 + fVar67;
        fVar54 = fVar65 * fVar47 + fVar68;
        fVar70 = fVar73 * fVar55;
        fVar71 = fVar73 * fVar59;
        fVar72 = fVar73 * fVar60;
        fVar73 = fVar73 * fVar50;
        fVar39 = fVar70 + fVar51;
        fVar41 = fVar71 + fVar52;
        fVar43 = fVar72 + fVar53;
        fVar45 = fVar73 + fVar54;
        auVar63._4_4_ = fVar41;
        auVar63._0_4_ = fVar39;
        auVar63._8_4_ = fVar43;
        auVar63._12_4_ = fVar45;
        auVar63 = minps(_DAT_01f7a9f0,auVar63);
        auVar49._4_4_ = fVar41;
        auVar49._0_4_ = fVar39;
        auVar49._8_4_ = fVar43;
        auVar49._12_4_ = fVar45;
        auVar49 = maxps((undefined1  [16])_DAT_01f7aa00,auVar49);
        fVar61 = auVar56._0_4_;
        fVar58 = auVar56._4_4_;
        fVar39 = auVar56._8_4_;
        fVar40 = fVar39 * fVar36 + fVar40;
        fVar42 = fVar39 * fVar37 + fVar42;
        fVar44 = fVar39 * fVar33 + fVar44;
        fVar46 = fVar39 * fVar38 + fVar46;
        fVar33 = fVar65 * fVar48 + fVar40;
        fVar36 = fVar65 * fVar34 + fVar42;
        fVar37 = fVar65 * fVar69 + fVar44;
        fVar38 = fVar65 * fVar47 + fVar46;
        fVar39 = fVar70 + fVar33;
        fVar41 = fVar71 + fVar36;
        fVar43 = fVar72 + fVar37;
        fVar45 = fVar73 + fVar38;
        auVar16._4_4_ = fVar41;
        auVar16._0_4_ = fVar39;
        auVar16._8_4_ = fVar43;
        auVar16._12_4_ = fVar45;
        auVar63 = minps(auVar63,auVar16);
        auVar17._4_4_ = fVar41;
        auVar17._0_4_ = fVar39;
        auVar17._8_4_ = fVar43;
        auVar17._12_4_ = fVar45;
        auVar49 = maxps(auVar49,auVar17);
        fVar62 = fVar62 + fVar58 * fVar48;
        fVar66 = fVar66 + fVar58 * fVar34;
        fVar67 = fVar67 + fVar58 * fVar69;
        fVar68 = fVar68 + fVar58 * fVar47;
        fVar39 = fVar70 + fVar62;
        fVar41 = fVar71 + fVar66;
        fVar43 = fVar72 + fVar67;
        fVar45 = fVar73 + fVar68;
        auVar56._4_4_ = fVar41;
        auVar56._0_4_ = fVar39;
        auVar56._8_4_ = fVar43;
        auVar56._12_4_ = fVar45;
        auVar63 = minps(auVar63,auVar56);
        auVar13._4_4_ = fVar41;
        auVar13._0_4_ = fVar39;
        auVar13._8_4_ = fVar43;
        auVar13._12_4_ = fVar45;
        auVar49 = maxps(auVar49,auVar13);
        fVar40 = fVar58 * fVar48 + fVar40;
        fVar42 = fVar58 * fVar34 + fVar42;
        fVar44 = fVar58 * fVar69 + fVar44;
        fVar46 = fVar58 * fVar47 + fVar46;
        fVar70 = fVar70 + fVar40;
        fVar71 = fVar71 + fVar42;
        fVar72 = fVar72 + fVar44;
        fVar73 = fVar73 + fVar46;
        auVar18._4_4_ = fVar71;
        auVar18._0_4_ = fVar70;
        auVar18._8_4_ = fVar72;
        auVar18._12_4_ = fVar73;
        auVar63 = minps(auVar63,auVar18);
        auVar19._4_4_ = fVar71;
        auVar19._0_4_ = fVar70;
        auVar19._8_4_ = fVar72;
        auVar19._12_4_ = fVar73;
        auVar49 = maxps(auVar49,auVar19);
        fVar55 = fVar61 * fVar55;
        fVar59 = fVar61 * fVar59;
        fVar60 = fVar61 * fVar60;
        fVar61 = fVar61 * fVar50;
        fVar51 = fVar51 + fVar55;
        fVar52 = fVar52 + fVar59;
        fVar53 = fVar53 + fVar60;
        fVar54 = fVar54 + fVar61;
        auVar14._4_4_ = fVar52;
        auVar14._0_4_ = fVar51;
        auVar14._8_4_ = fVar53;
        auVar14._12_4_ = fVar54;
        auVar63 = minps(auVar63,auVar14);
        auVar15._4_4_ = fVar52;
        auVar15._0_4_ = fVar51;
        auVar15._8_4_ = fVar53;
        auVar15._12_4_ = fVar54;
        auVar49 = maxps(auVar49,auVar15);
        auVar35._0_4_ = fVar33 + fVar55;
        auVar35._4_4_ = fVar36 + fVar59;
        auVar35._8_4_ = fVar37 + fVar60;
        auVar35._12_4_ = fVar38 + fVar61;
        auVar63 = minps(auVar63,auVar35);
        auVar49 = maxps(auVar49,auVar35);
        auVar64._0_4_ = fVar62 + fVar55;
        auVar64._4_4_ = fVar66 + fVar59;
        auVar64._8_4_ = fVar67 + fVar60;
        auVar64._12_4_ = fVar68 + fVar61;
        auVar63 = minps(auVar63,auVar64);
        auVar49 = maxps(auVar49,auVar64);
        auVar57._0_4_ = fVar55 + fVar40;
        auVar57._4_4_ = fVar59 + fVar42;
        auVar57._8_4_ = fVar60 + fVar44;
        auVar57._12_4_ = fVar61 + fVar46;
        in_XMM6 = minps(auVar63,auVar57);
        in_XMM7 = maxps(auVar49,auVar57);
      }
      auVar31 = minps(auVar31,in_XMM6);
      auVar29 = auVar31._0_12_;
      aVar32.m128 = (__m128)maxps(aVar32.m128,in_XMM7);
      uVar7 = this->geomID_;
      *(uint *)(pcVar23 + lVar26 * 8) = uVar5;
      *(uint *)(pcVar23 + lVar26 * 8 + 4) = uVar7;
      lVar26 = lVar26 + 1;
    } while (uVar21 + (uVar21 == 0) != lVar26);
  }
  uVar22 = 7;
  if (uVar21 < 7) {
    uVar22 = uVar21;
  }
  aVar30.m128[3] = (float)(current->_end - current->_begin);
  aVar30._0_12_ = auVar29;
  (__return_storage_ptr__->ref).ptr = uVar22 | (ulong)pcVar23 | 8;
  (__return_storage_ptr__->bounds).lower.field_0 = aVar30;
  (__return_storage_ptr__->bounds).upper.field_0 = aVar32;
  return __return_storage_ptr__;
}

Assistant:

operator() (const range<unsigned>& current, const FastAllocator::CachedAllocator& alloc)
      {
        vfloat4 lower(pos_inf);
        vfloat4 upper(neg_inf);
        size_t items = current.size();
        size_t start = current.begin();
        assert(items <= 1);

        /* allocate leaf node */
        InstanceArrayPrimitive* accel = (InstanceArrayPrimitive*) alloc.malloc1(items*sizeof(InstanceArrayPrimitive),BVH::byteAlignment);
        NodeRef ref = BVH::encodeLeaf((char*)accel,items);
        const InstanceArray* instance = this->mesh;

        BBox3fa bounds = empty;
        for (size_t i=0; i<items; i++)
        {
          const unsigned int primID = morton[start+i].index;
          bounds.extend(instance->bounds(primID));
          new (&accel[i]) InstanceArrayPrimitive(geomID_, primID);
        }

        BBox3fx box_o = (BBox3fx&)bounds;
#if ROTATE_TREE
        if (N == 4)
          box_o.lower.a = current.size();
#endif
        return NodeRecord(ref,box_o);
      }